

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressbar.cpp
# Opt level: O3

void QProgressBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  byte bVar2;
  QString *format;
  byte *pbVar3;
  QProgressBarPrivate *this;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QArrayData *pQVar8;
  undefined4 *puVar9;
  byte bVar10;
  undefined4 uVar11;
  int iVar12;
  int minimum;
  Orientation orientation;
  long in_FS_OFFSET;
  undefined4 local_3c;
  QArrayData *local_38;
  undefined4 *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_3c = *_a[1];
      local_30 = &local_3c;
      local_38 = (QArrayData *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
      goto switchD_00469da1_caseD_2;
    case 1:
      *(int *)(*(long *)(_o + 8) + 0x25c) = *(int *)(*(long *)(_o + 8) + 0x254) + -1;
      goto LAB_00469f97;
    case 2:
      minimum = *_a[1];
      iVar12 = *_a[2];
      break;
    case 3:
      minimum = *_a[1];
LAB_00469e6b:
      iVar12 = *(int *)(*(long *)(_o + 8) + 600);
      if (*(int *)(*(long *)(_o + 8) + 600) <= minimum) {
        iVar12 = minimum;
      }
      break;
    case 4:
      iVar12 = *_a[1];
LAB_00469f01:
      minimum = *(int *)(*(long *)(_o + 8) + 0x254);
      if (iVar12 <= *(int *)(*(long *)(_o + 8) + 0x254)) {
        minimum = iVar12;
      }
      break;
    case 5:
      iVar12 = *_a[1];
LAB_00469eb3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setValue((QProgressBar *)_o,iVar12);
        return;
      }
      goto LAB_0046a125;
    case 6:
      orientation = *_a[1];
LAB_00469eda:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setOrientation((QProgressBar *)_o,orientation);
        return;
      }
      goto LAB_0046a125;
    default:
      goto switchD_00469da1_caseD_2;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      setRange((QProgressBar *)_o,minimum,iVar12);
      return;
    }
    goto LAB_0046a125;
  case ReadProperty:
    if (9 < (uint)_id) break;
    pbVar3 = (byte *)*_a;
    switch(_id) {
    case 0:
      uVar11 = *(undefined4 *)(*(long *)(_o + 8) + 0x254);
      break;
    case 1:
      uVar11 = *(undefined4 *)(*(long *)(_o + 8) + 600);
      break;
    case 2:
      (**(code **)(*(long *)_o + 0x1a0))(&local_38,_o);
      pQVar8 = *(QArrayData **)pbVar3;
      *(QArrayData **)pbVar3 = local_38;
      puVar9 = *(undefined4 **)(pbVar3 + 8);
      *(undefined4 **)(pbVar3 + 8) = local_30;
      uVar6 = *(undefined8 *)(pbVar3 + 0x10);
      *(undefined8 *)(pbVar3 + 0x10) = local_28;
      local_38 = pQVar8;
      local_30 = puVar9;
      local_28 = uVar6;
      if (pQVar8 != (QArrayData *)0x0) {
        LOCK();
        (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar8,2,0x10);
        }
      }
      goto switchD_00469da1_caseD_2;
    case 3:
      uVar11 = *(undefined4 *)(*(long *)(_o + 8) + 0x25c);
      break;
    case 4:
      uVar11 = *(undefined4 *)(*(long *)(_o + 8) + 0x260);
      break;
    case 5:
      bVar10 = *(byte *)(*(long *)(_o + 8) + 0x264) & 1;
      goto LAB_0046a0ed;
    case 6:
      uVar11 = *(undefined4 *)(*(long *)(_o + 8) + 0x26c);
      break;
    case 7:
      bVar10 = *(byte *)(*(long *)(_o + 8) + 0x270);
LAB_0046a0ed:
      *pbVar3 = bVar10;
      goto switchD_00469da1_caseD_2;
    case 8:
      uVar11 = *(undefined4 *)(*(long *)(_o + 8) + 0x274);
      break;
    case 9:
      lVar4 = *(long *)(_o + 8);
      piVar5 = *(int **)(lVar4 + 0x278);
      uVar6 = *(undefined8 *)(lVar4 + 0x280);
      uVar7 = *(undefined8 *)(lVar4 + 0x288);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      pQVar8 = *(QArrayData **)pbVar3;
      *(int **)pbVar3 = piVar5;
      *(undefined8 *)(pbVar3 + 8) = uVar6;
      *(undefined8 *)(pbVar3 + 0x10) = uVar7;
      if (pQVar8 != (QArrayData *)0x0) {
        LOCK();
        (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            QArrayData::deallocate(pQVar8,2,0x10);
            return;
          }
          goto LAB_0046a125;
        }
      }
      goto switchD_00469da1_caseD_2;
    }
    *(undefined4 *)pbVar3 = uVar11;
    break;
  case WriteProperty:
    if (9 < (uint)_id) break;
    format = (QString *)*_a;
    switch(_id) {
    case 0:
      minimum = *(int *)&(format->d).d;
      goto LAB_00469e6b;
    case 1:
      iVar12 = *(int *)&(format->d).d;
      goto LAB_00469f01;
    case 3:
      iVar12 = *(int *)&(format->d).d;
      goto LAB_00469eb3;
    case 4:
      iVar12 = *(int *)&(format->d).d;
      if (*(int *)(*(long *)(_o + 8) + 0x260) != iVar12) {
        *(int *)(*(long *)(_o + 8) + 0x260) = iVar12;
LAB_00469f97:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QWidget::repaint((QWidget *)_o);
          return;
        }
        goto LAB_0046a125;
      }
      break;
    case 5:
      bVar10 = *(byte *)&(format->d).d;
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x264);
      if (((bVar2 ^ bVar10) & 1) != 0) {
        *(byte *)(*(long *)(_o + 8) + 0x264) = bVar2 & 0xfe | bVar10;
        goto LAB_00469f97;
      }
      break;
    case 6:
      orientation = *(Orientation *)&(format->d).d;
      goto LAB_00469eda;
    case 7:
      *(undefined1 *)(*(long *)(_o + 8) + 0x270) = *(undefined1 *)&(format->d).d;
      goto LAB_00469e24;
    case 8:
      *(undefined4 *)(*(long *)(_o + 8) + 0x274) = *(undefined4 *)&(format->d).d;
LAB_00469e24:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QWidget::update((QWidget *)_o);
        return;
      }
      goto LAB_0046a125;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setFormat((QProgressBar *)_o,format);
        return;
      }
      goto LAB_0046a125;
    }
    break;
  default:
    if (_id == 9 && _c == ResetProperty) {
      this = *(QProgressBarPrivate **)(_o + 8);
      puVar1 = &this->field_0x264;
      *puVar1 = *puVar1 | 2;
      QProgressBarPrivate::initDefaultFormat(this);
      goto LAB_00469e24;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == valueChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
switchD_00469da1_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0046a125:
  __stack_chk_fail();
}

Assistant:

void QProgressBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->reset(); break;
        case 2: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressBar::*)(int )>(_a, &QProgressBar::valueChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isTextVisible(); break;
        case 6: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->invertedAppearance(); break;
        case 8: *reinterpret_cast<Direction*>(_v) = _t->textDirection(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->format(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setTextVisible(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 7: _t->setInvertedAppearance(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTextDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 9: _t->setFormat(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 9: _t->resetFormat(); break;
        default: break;
        }
    }
}